

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O3

bool __thiscall CFG::anon_unknown_11::Optimizer::IsEmpty(Optimizer *this,Expression *Code)

{
  char cVar1;
  Block *pBVar2;
  byte in_AL;
  Block *pBVar3;
  bool bVar4;
  
  cVar1 = *(char *)&(this->super_RelooperRecursor).Parent;
  bVar4 = true;
  if (cVar1 != '\x16') {
    if (cVar1 == '\x01') {
      pBVar2 = this[2].Entry;
      if (pBVar2 == (Block *)0x0) {
        in_AL = 1;
      }
      else {
        pBVar3 = (Block *)0x0;
        do {
          if (this[2].Entry <= pBVar3) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          in_AL = IsEmpty((Optimizer *)
                          (&(this[2].super_RelooperRecursor.Parent)->Module)[(long)pBVar3],Code);
        } while (((bool)in_AL) &&
                (bVar4 = (Block *)&pBVar2[-1].field_0x16f != pBVar3,
                pBVar3 = (Block *)((long)&pBVar3->relooper + 1), bVar4));
      }
    }
    bVar4 = (bool)(cVar1 == '\x01' & in_AL);
  }
  return bVar4;
}

Assistant:

bool IsEmpty(wasm::Expression* Code) {
    if (Code->is<wasm::Nop>()) {
      return true; // a nop
    }
    if (auto* WasmBlock = Code->dynCast<wasm::Block>()) {
      for (auto* Item : WasmBlock->list) {
        if (!IsEmpty(Item)) {
          return false;
        }
      }
      return true; // block with no non-empty contents
    }
    return false;
  }